

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QTextLength>::copyAppend
          (QPodArrayOps<QTextLength> *this,QTextLength *b,QTextLength *e)

{
  qsizetype *pqVar1;
  
  if (b != e) {
    memcpy((this->super_QArrayDataPointer<QTextLength>).ptr +
           (this->super_QArrayDataPointer<QTextLength>).size,b,(long)e - (long)b);
    pqVar1 = &(this->super_QArrayDataPointer<QTextLength>).size;
    *pqVar1 = *pqVar1 + ((long)e - (long)b >> 4);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e) noexcept
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        ::memcpy(static_cast<void *>(this->end()), static_cast<const void *>(b), (e - b) * sizeof(T));
        this->size += (e - b);
    }